

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_str_pad(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxu32 sVar2;
  jx9_context *pjVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  jx9_value *pjVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  int iStrpad;
  int iLen;
  int local_58;
  int local_54;
  char *local_50;
  jx9_context *local_48;
  char *local_40;
  uint local_34;
  
  if (nArg < 2) {
    pjVar7 = pCtx->pRet;
    pcVar6 = "";
    local_54 = 0;
LAB_00132803:
    jx9_value_string(pjVar7,pcVar6,local_54);
    return 0;
  }
  local_48 = pCtx;
  pcVar6 = jx9_value_to_string(*apArg,&local_54);
  pjVar7 = apArg[1];
  jx9MemObjToInteger(pjVar7);
  iVar1 = *(int *)&pjVar7->x;
  iVar5 = 0;
  if (0 < iVar1) {
    iVar5 = local_54;
  }
  uVar8 = iVar1 - iVar5;
  if (uVar8 == 0 || iVar1 < iVar5) {
    pjVar7 = local_48->pRet;
    goto LAB_00132803;
  }
  local_58 = 1;
  local_50 = pcVar6;
  if (nArg == 2) {
    local_40 = " ";
LAB_00132867:
    bVar12 = false;
    uVar10 = 1;
  }
  else {
    local_40 = jx9_value_to_string(apArg[2],&local_58);
    if (local_58 < 1) {
      local_58 = 1;
      local_40 = " ";
    }
    if ((uint)nArg < 4) goto LAB_00132867;
    pjVar7 = apArg[3];
    jx9MemObjToInteger(pjVar7);
    iVar5 = local_58;
    uVar10 = *(uint *)&pjVar7->x;
    if ((uVar10 & 0xfffffffd) != 0) goto LAB_00132867;
    bVar12 = uVar10 == 2;
    if ((uVar10 & 0xfffffffd) == 0) {
      uVar4 = uVar8 >> (uVar10 == 2);
      local_34 = uVar10;
      if (uVar4 != 0) {
        iVar9 = 0;
        do {
          if (iVar1 <= (int)((local_48->pRet->sBlob).nByte + iVar5 + local_54)) break;
          jx9_value_string(local_48->pRet,local_40,iVar5);
          iVar9 = iVar9 + iVar5;
        } while (iVar9 < (int)uVar4);
      }
      pcVar6 = local_40;
      uVar10 = local_34;
      if (local_34 == 0) {
        pjVar7 = local_48->pRet;
        iVar5 = (pjVar7->sBlob).nByte + local_54;
        while (iVar5 < iVar1) {
          iVar9 = iVar1 - iVar5;
          if (local_58 <= iVar1 - iVar5) {
            iVar9 = local_58;
          }
          if (iVar9 < 1) {
            bVar12 = false;
            uVar10 = 0;
            goto LAB_0013286a;
          }
          jx9_value_string(pjVar7,pcVar6,iVar9);
          pjVar7 = local_48->pRet;
          iVar5 = (pjVar7->sBlob).nByte + local_54;
        }
        bVar11 = false;
        bVar12 = false;
        goto LAB_00132887;
      }
    }
  }
LAB_0013286a:
  bVar11 = uVar10 - 1 < 2;
  pcVar6 = local_40;
LAB_00132887:
  pjVar3 = local_48;
  if (0 < local_54) {
    jx9_value_string(local_48->pRet,local_50,local_54);
  }
  if (!bVar11) {
    return 0;
  }
  if (0 < (int)(uVar8 >> bVar12)) {
    iVar5 = 0;
    do {
      pjVar7 = pjVar3->pRet;
      if (iVar1 <= (int)((pjVar7->sBlob).nByte + local_58)) break;
      jx9_value_string(pjVar7,pcVar6,local_58);
      iVar5 = iVar5 + local_58;
    } while (iVar5 < (int)(uVar8 >> bVar12));
  }
  while( true ) {
    pjVar7 = pjVar3->pRet;
    sVar2 = (pjVar7->sBlob).nByte;
    if (iVar1 <= (int)sVar2) {
      return 0;
    }
    iVar5 = iVar1 - sVar2;
    if (local_58 <= iVar5) {
      iVar5 = local_58;
    }
    if (iVar5 < 1) break;
    jx9_value_string(pjVar7,pcVar6,iVar5);
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_pad(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen, iPadlen, iType, i, iDiv, iStrpad, iRealPad, jPad;
	const char *zIn, *zPad;
	if( nArg < 2 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &iLen);
	/* Padding length */
	iRealPad = iPadlen = jx9_value_to_int(apArg[1]);
	if( iPadlen > 0 ){
		iPadlen -= iLen;
	}
	if( iPadlen < 1  ){
		/* Return the string verbatim */
		jx9_result_string(pCtx, zIn, iLen);
		return JX9_OK;
	}
	zPad = " "; /* Whitespace padding */
	iStrpad = (int)sizeof(char);
	iType = 1 ; /* STR_PAD_RIGHT */
	if( nArg > 2 ){
		/* Padding string */
		zPad = jx9_value_to_string(apArg[2], &iStrpad);
		if( iStrpad < 1 ){
			/* Empty string */
			zPad = " "; /* Whitespace padding */
			iStrpad = (int)sizeof(char);
		}
		if( nArg > 3 ){
			/* Padd type */
			iType = jx9_value_to_int(apArg[3]);
			if( iType != 0 /* STR_PAD_LEFT */ && iType != 2 /* STR_PAD_BOTH */ ){
				iType = 1 ; /* STR_PAD_RIGHT */
			}
		}
	}
	iDiv = 1;
	if( iType == 2 ){
		iDiv = 2; /* STR_PAD_BOTH */
	}
	/* Perform the requested operation */
	if( iType == 0 /* STR_PAD_LEFT */ || iType == 2 /* STR_PAD_BOTH */ ){
		jPad = iStrpad;
		for( i = 0 ; i < iPadlen/iDiv ; i += jPad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iLen + jPad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
		if( iType == 0 /* STR_PAD_LEFT */ ){
			while( (int)jx9_context_result_buf_length(pCtx) + iLen < iRealPad ){
				jPad = iRealPad - (iLen + (int)jx9_context_result_buf_length(pCtx) );
				if( jPad > iStrpad ){
					jPad = iStrpad;
				}
				if( jPad < 1){
					break;
				}
				jx9_result_string(pCtx, zPad, jPad);
			}
		}
	}
	if( iLen > 0 ){
		/* Append the input string */
		jx9_result_string(pCtx, zIn, iLen);
	}
	if( iType == 1 /* STR_PAD_RIGHT */ || iType == 2 /* STR_PAD_BOTH */ ){
		for( i = 0 ; i < iPadlen/iDiv ; i += iStrpad ){
			/* Padding */
			if( (int)jx9_context_result_buf_length(pCtx) + iStrpad >= iRealPad ){
				break;
			}
			jx9_result_string(pCtx, zPad, iStrpad);
		}
		while( (int)jx9_context_result_buf_length(pCtx) < iRealPad ){
			jPad = iRealPad - (int)jx9_context_result_buf_length(pCtx);
			if( jPad > iStrpad ){
				jPad = iStrpad;
			}
			if( jPad < 1){
				break;
			}
			jx9_result_string(pCtx, zPad, jPad);
		}
	}
	return JX9_OK;
}